

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O1

UBool __thiscall icu_63::RBBIRuleScanner::doParseActions(RBBIRuleScanner *this,int32_t action)

{
  uint uVar1;
  uint uVar2;
  UErrorCode UVar3;
  UParseError *pUVar4;
  UErrorCode *pUVar5;
  UBool UVar6;
  int32_t iVar7;
  int iVar8;
  RBBINode *pRVar9;
  undefined4 extraout_var;
  _func_int **pp_Var10;
  long lVar11;
  RBBINode *pRVar12;
  RBBINode *pRVar13;
  RBBIRuleBuilder *pRVar14;
  RBBINode **ppRVar15;
  UErrorCode t;
  NodeType NVar16;
  UnicodeString *pUVar17;
  RBBINode *prevRules;
  bool bVar18;
  UnicodeString opt;
  UnicodeString UStack_198;
  ConstChar16Ptr local_158;
  ConstChar16Ptr local_150;
  ConstChar16Ptr local_148;
  ConstChar16Ptr local_140;
  ConstChar16Ptr local_138;
  ConstChar16Ptr local_130;
  ConstChar16Ptr local_128;
  ConstChar16Ptr local_120;
  ConstChar16Ptr local_118;
  ConstChar16Ptr local_110;
  UnicodeString local_108;
  UChar *local_c8;
  char16_t *local_b8;
  char16_t *local_a8;
  char16_t *local_98;
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  char16_t *local_58;
  char16_t *local_48;
  char16_t *local_38;
  
  switch(action) {
  case 0:
    if (this->fNodeStack[this->fNodeStackPtr]->fLeftChild != (RBBINode *)0x0) break;
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) {
      return '\0';
    }
    *pRVar14->fStatus = U_BRK_UNDEFINED_VARIABLE;
    goto LAB_00324f2b;
  case 1:
    pRVar9 = pushNewNode(this,setRef);
    if (U_ZERO_ERROR < *this->fRB->fStatus) break;
    local_110.p_ = L"any";
    icu_63::UnicodeString::UnicodeString(&local_108,'\x01',&local_110,3);
    findSetFor(this,&local_108,pRVar9,(UnicodeSet *)0x0);
    icu_63::UnicodeString::~UnicodeString(&local_108);
    local_c8 = local_110.p_;
    goto LAB_00324b65;
  case 2:
    fixOpStack(this,precStart);
    lVar11 = (long)this->fNodeStackPtr;
    pRVar9 = this->fNodeStack[lVar11 + -2];
    pRVar13 = this->fNodeStack[lVar11 + -1];
    pRVar12 = this->fNodeStack[lVar11];
    pRVar12->fFirstPos = pRVar9->fFirstPos;
    pRVar12->fLastPos = this->fScanIndex;
    (*(this->fRB->fRules->super_Replaceable).super_UObject._vptr_UObject[3])();
    pRVar13->fLeftChild = pRVar12;
    pRVar12->fParent = pRVar13;
    pUVar17 = &pRVar13->fText;
    (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[6])
              (this->fSymbolTable,pUVar17,pRVar13,this->fRB->fStatus);
    pRVar14 = this->fRB;
    pUVar5 = pRVar14->fStatus;
    UVar3 = *pUVar5;
    if (U_ZERO_ERROR < UVar3) {
      *pUVar5 = UVar3;
      pUVar4 = pRVar14->fParseError;
      if (pUVar4 != (UParseError *)0x0) {
        pUVar4->line = this->fLineNum;
        pUVar4->offset = this->fCharNum;
        pUVar4->preContext[0] = L'\0';
        pUVar4->postContext[0] = L'\0';
      }
    }
    if (pRVar9 != (RBBINode *)0x0) {
      RBBINode::~RBBINode(pRVar9);
      UMemory::operator_delete((UMemory *)pRVar9,pUVar17);
    }
    this->fNodeStackPtr = this->fNodeStackPtr + -3;
    break;
  case 3:
    fixOpStack(this,precStart);
    if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar9 = this->fNodeStack[this->fNodeStackPtr];
      pRVar13 = pRVar9;
      if (this->fLookAheadRule != '\0') {
        pRVar12 = pushNewNode(this,endMark);
        pRVar13 = pushNewNode(this,opCat);
        if (U_ZERO_ERROR < *this->fRB->fStatus) break;
        iVar8 = this->fNodeStackPtr;
        this->fNodeStackPtr = iVar8 + -2;
        pRVar13->fLeftChild = pRVar9;
        pRVar13->fRightChild = pRVar12;
        this->fNodeStack[(long)iVar8 + -2] = pRVar13;
        pRVar12->fVal = this->fRuleNum;
        pRVar12->fLookAheadEnd = '\x01';
      }
      pRVar13->fRuleRoot = '\x01';
      pRVar14 = this->fRB;
      if ((pRVar14->fChainRules != '\0') && (this->fNoChainInRule == '\0')) {
        pRVar13->fChainIn = '\x01';
      }
      if (this->fReverseRule == '\0') {
        ppRVar15 = pRVar14->fDefaultTree;
      }
      else {
        ppRVar15 = &pRVar14->fSafeRevTree;
      }
      pRVar9 = *ppRVar15;
      pRVar13 = this->fNodeStack[this->fNodeStackPtr];
      pRVar12 = pRVar13;
      if (pRVar9 != (RBBINode *)0x0) {
        pRVar12 = pushNewNode(this,opOr);
        if (U_ZERO_ERROR < *this->fRB->fStatus) break;
        pRVar12->fLeftChild = pRVar9;
        pRVar9->fParent = pRVar12;
        pRVar12->fRightChild = pRVar13;
        pRVar13->fParent = pRVar12;
      }
      *ppRVar15 = pRVar12;
      *(undefined4 *)((long)&this->fNodeStackPtr + 3) = 0;
      this->fNodeStackPtr = 0;
    }
    break;
  case 4:
    pRVar9 = this->fNodeStack[this->fNodeStackPtr];
    if ((pRVar9 != (RBBINode *)0x0) && (pRVar9->fType == varRef)) {
      uVar1 = this->fScanIndex;
      pRVar9->fLastPos = uVar1;
      pUVar17 = this->fRB->fRules;
      (*(pUVar17->super_Replaceable).super_UObject._vptr_UObject[3])
                (pUVar17,(ulong)(pRVar9->fFirstPos + 1),(ulong)uVar1,&pRVar9->fText);
      iVar8 = (*(this->fSymbolTable->super_SymbolTable)._vptr_SymbolTable[5])
                        (this->fSymbolTable,&pRVar9->fText);
      pRVar9->fLeftChild = (RBBINode *)CONCAT44(extraout_var,iVar8);
      break;
    }
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) break;
    *pRVar14->fStatus = U_BRK_ERROR_START;
    goto LAB_00324f6c;
  case 5:
    goto LAB_00325251;
  case 6:
    fixOpStack(this,precOpCat);
    iVar8 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar8 + -1;
    pRVar9 = this->fNodeStack[iVar8];
    NVar16 = opCat;
    goto LAB_00324ef5;
  case 7:
  case 0xc:
    break;
  case 8:
    fixOpStack(this,precOpCat);
    iVar8 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar8 + -1;
    pRVar9 = this->fNodeStack[iVar8];
    NVar16 = opOr;
    goto LAB_00324ef5;
  case 9:
    fixOpStack(this,precLParen);
    break;
  case 10:
    pushNewNode(this,opStart);
    this->fRuleNum = this->fRuleNum + 1;
    break;
  case 0xb:
    NVar16 = opLParen;
    goto LAB_00324e57;
  case 0xd:
    this->fNoChainInRule = '\x01';
    break;
  case 0xe:
    icu_63::UnicodeString::UnicodeString
              (&local_108,this->fRB->fRules,this->fOptionStart,this->fScanIndex - this->fOptionStart
              );
    local_118.p_ = L"chain";
    icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_118,5);
    if ((local_108.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) {
      if (-1 < local_108.fUnion.fStackFields.fLengthAndFlags) {
        local_108.fUnion.fFields.fLength = (int)local_108.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      if (-1 < UStack_198.fUnion.fStackFields.fLengthAndFlags) {
        UStack_198.fUnion.fFields.fLength = (int)UStack_198.fUnion.fStackFields.fLengthAndFlags >> 5
        ;
      }
      bVar18 = false;
      if ((((int)UStack_198.fUnion.fStackFields.fLengthAndFlags & 1U) == 0) &&
         (bVar18 = false, local_108.fUnion.fFields.fLength == UStack_198.fUnion.fFields.fLength)) {
        UVar6 = icu_63::UnicodeString::doEquals
                          (&local_108,&UStack_198,local_108.fUnion.fFields.fLength);
        bVar18 = UVar6 != '\0';
      }
    }
    else {
      bVar18 = (bool)(UStack_198.fUnion.fStackFields.fLengthAndFlags._0_1_ & 1);
    }
    icu_63::UnicodeString::~UnicodeString(&UStack_198);
    local_38 = local_118.p_;
    if (bVar18 == false) {
      local_120.p_ = L"LBCMNoChain";
      icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_120,0xb);
      UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
      icu_63::UnicodeString::~UnicodeString(&UStack_198);
      local_48 = local_120.p_;
      if (UVar6 == '\0') {
        local_128.p_ = L"forward";
        icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_128,7);
        UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
        icu_63::UnicodeString::~UnicodeString(&UStack_198);
        local_58 = local_128.p_;
        if (UVar6 == '\0') {
          local_130.p_ = L"reverse";
          icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_130,7);
          UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
          icu_63::UnicodeString::~UnicodeString(&UStack_198);
          local_68 = local_130.p_;
          if (UVar6 == '\0') {
            local_138.p_ = L"safe_forward";
            icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_138,0xc);
            UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
            icu_63::UnicodeString::~UnicodeString(&UStack_198);
            local_78 = local_138.p_;
            if (UVar6 == '\0') {
              local_140.p_ = L"safe_reverse";
              icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_140,0xc);
              UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
              icu_63::UnicodeString::~UnicodeString(&UStack_198);
              local_88 = local_140.p_;
              if (UVar6 == '\0') {
                local_148.p_ = L"lookAheadHardBreak";
                icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_148,0x12);
                UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
                icu_63::UnicodeString::~UnicodeString(&UStack_198);
                local_98 = local_148.p_;
                if (UVar6 == '\0') {
                  local_150.p_ = L"quoted_literals_only";
                  icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_150,0x14);
                  UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
                  icu_63::UnicodeString::~UnicodeString(&UStack_198);
                  local_a8 = local_150.p_;
                  if (UVar6 == '\0') {
                    local_158.p_ = L"unquoted_literals";
                    icu_63::UnicodeString::UnicodeString(&UStack_198,'\x01',&local_158,0x11);
                    UVar6 = icu_63::UnicodeString::operator==(&local_108,&UStack_198);
                    icu_63::UnicodeString::~UnicodeString(&UStack_198);
                    local_b8 = local_158.p_;
                    if (UVar6 == '\0') {
                      pRVar14 = this->fRB;
                      pUVar5 = pRVar14->fStatus;
                      if (*pUVar5 < U_ILLEGAL_ARGUMENT_ERROR) {
                        *pUVar5 = U_BRK_UNRECOGNIZED_OPTION;
                        pUVar4 = pRVar14->fParseError;
                        if (pUVar4 != (UParseError *)0x0) {
                          pUVar4->line = this->fLineNum;
                          pUVar4->offset = this->fCharNum;
                          pUVar4->preContext[0] = L'\0';
                          pUVar4->postContext[0] = L'\0';
                        }
                      }
                    }
                    else {
                      icu_63::UnicodeString::UnicodeString
                                (&UStack_198,L"[^[\\p{Z}\\u0020-\\u007f]-[\\p{L}]-[\\p{N}]]");
                      UnicodeSet::applyPattern
                                ((UnicodeSet *)&this->field_0x588,&UStack_198,this->fRB->fStatus);
                      icu_63::UnicodeString::~UnicodeString(&UStack_198);
                    }
                  }
                  else {
                    UnicodeSet::clear((UnicodeSet *)&this->field_0x588);
                  }
                }
                else {
                  this->fRB->fLookAheadHardBreak = '\x01';
                }
                goto LAB_00325236;
              }
              pRVar14 = this->fRB;
              ppRVar15 = &pRVar14->fSafeRevTree;
            }
            else {
              pRVar14 = this->fRB;
              ppRVar15 = &pRVar14->fSafeFwdTree;
            }
          }
          else {
            pRVar14 = this->fRB;
            ppRVar15 = &pRVar14->fReverseTree;
          }
        }
        else {
          pRVar14 = this->fRB;
          ppRVar15 = &pRVar14->fForwardTree;
        }
        pRVar14->fDefaultTree = ppRVar15;
      }
      else {
        this->fRB->fLBCMNoChain = '\x01';
      }
    }
    else {
      this->fRB->fChainRules = '\x01';
    }
LAB_00325236:
    icu_63::UnicodeString::~UnicodeString(&local_108);
    break;
  case 0xf:
    this->fOptionStart = this->fScanIndex;
    break;
  case 0x10:
    this->fReverseRule = '\x01';
    break;
  case 0x11:
    pRVar9 = pushNewNode(this,setRef);
    if (U_ZERO_ERROR < *this->fRB->fStatus) break;
    icu_63::UnicodeString::UnicodeString(&local_108,(this->fC).fChar);
    findSetFor(this,&local_108,pRVar9,(UnicodeSet *)0x0);
    icu_63::UnicodeString::~UnicodeString(&local_108);
LAB_00324b65:
    uVar2 = this->fScanIndex;
    pRVar9->fFirstPos = uVar2;
    uVar1 = this->fNextIndex;
    pRVar9->fLastPos = uVar1;
    pUVar17 = this->fRB->fRules;
    pp_Var10 = (pUVar17->super_Replaceable).super_UObject._vptr_UObject;
LAB_00324b85:
    (*pp_Var10[3])(pUVar17,(ulong)uVar2,(ulong)uVar1,&pRVar9->fText);
    break;
  case 0x12:
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) {
      return '\0';
    }
    *pRVar14->fStatus = U_BRK_RULE_SYNTAX;
    goto LAB_00324f2b;
  case 0x13:
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) {
      return '\0';
    }
    *pRVar14->fStatus = U_BRK_ASSIGN_ERROR;
    goto LAB_00324f2b;
  case 0x14:
    scanSet(this);
    break;
  case 0x15:
    pRVar9 = pushNewNode(this,lookAhead);
    pRVar14 = this->fRB;
    if (*pRVar14->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar9->fVal = this->fRuleNum;
      pRVar9->fFirstPos = this->fScanIndex;
      pRVar9->fLastPos = this->fNextIndex;
      (*(pRVar14->fRules->super_Replaceable).super_UObject._vptr_UObject[3])();
      this->fLookAheadRule = '\x01';
    }
    break;
  case 0x16:
    this->fNodeStack[(long)this->fNodeStackPtr + -1]->fFirstPos = this->fNextIndex;
    NVar16 = opStart;
LAB_00324e57:
    pushNewNode(this,NVar16);
    break;
  case 0x17:
    pRVar9 = pushNewNode(this,tag);
    if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar9->fVal = 0;
      pRVar9->fFirstPos = this->fScanIndex;
      pRVar9->fLastPos = this->fNextIndex;
    }
    break;
  case 0x18:
    pRVar9 = pushNewNode(this,varRef);
    if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar9->fFirstPos = this->fScanIndex;
    }
    break;
  case 0x19:
    pRVar9 = this->fNodeStack[this->fNodeStackPtr];
    iVar7 = u_charDigitValue_63((this->fC).fChar);
    pRVar9->fVal = iVar7 + pRVar9->fVal * 10;
    break;
  case 0x1a:
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) {
      return '\0';
    }
    *pRVar14->fStatus = U_BRK_MALFORMED_RULE_TAG;
    goto LAB_00324f2b;
  case 0x1b:
    pRVar9 = this->fNodeStack[this->fNodeStackPtr];
    uVar1 = this->fNextIndex;
    pRVar9->fLastPos = uVar1;
    pUVar17 = this->fRB->fRules;
    uVar2 = pRVar9->fFirstPos;
    pp_Var10 = (pUVar17->super_Replaceable).super_UObject._vptr_UObject;
    goto LAB_00324b85;
  case 0x1c:
    iVar8 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar8 + -1;
    pRVar9 = this->fNodeStack[iVar8];
    NVar16 = opPlus;
    goto LAB_00324ef5;
  case 0x1d:
    iVar8 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar8 + -1;
    pRVar9 = this->fNodeStack[iVar8];
    NVar16 = opQuestion;
    goto LAB_00324ef5;
  case 0x1e:
    iVar8 = this->fNodeStackPtr;
    this->fNodeStackPtr = iVar8 + -1;
    pRVar9 = this->fNodeStack[iVar8];
    NVar16 = opStar;
LAB_00324ef5:
    pRVar13 = pushNewNode(this,NVar16);
    if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      pRVar13->fLeftChild = pRVar9;
      pRVar9->fParent = pRVar13;
    }
    break;
  case 0x1f:
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) break;
    *pRVar14->fStatus = U_BRK_RULE_SYNTAX;
LAB_00324f6c:
    pUVar4 = pRVar14->fParseError;
    if (pUVar4 != (UParseError *)0x0) {
      pUVar4->line = this->fLineNum;
      pUVar4->offset = this->fCharNum;
      pUVar4->preContext[0] = L'\0';
      pUVar4->postContext[0] = L'\0';
    }
    break;
  default:
    pRVar14 = this->fRB;
    if (U_ZERO_ERROR < *pRVar14->fStatus) {
      return '\0';
    }
    *pRVar14->fStatus = U_BRK_ERROR_START;
LAB_00324f2b:
    pUVar4 = pRVar14->fParseError;
    if (pUVar4 != (UParseError *)0x0) {
      pUVar4->line = this->fLineNum;
      pUVar4->offset = this->fCharNum;
      pUVar4->preContext[0] = L'\0';
      pUVar4->postContext[0] = L'\0';
      return '\0';
    }
LAB_00325251:
    return '\0';
  }
  return *this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool RBBIRuleScanner::doParseActions(int32_t action)
{
    RBBINode *n       = NULL;

    UBool   returnVal = TRUE;

    switch (action) {

    case doExprStart:
        pushNewNode(RBBINode::opStart);
        fRuleNum++;
        break;


    case doNoChain:
        // Scanned a '^' while on the rule start state.
        fNoChainInRule = TRUE;
        break;


    case doExprOrOperator:
        {
            fixOpStack(RBBINode::precOpCat);
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *orNode      = pushNewNode(RBBINode::opOr);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            orNode->fLeftChild     = operandNode;
            operandNode->fParent   = orNode;
        }
        break;

    case doExprCatOperator:
        // concatenation operator.
        // For the implicit concatenation of adjacent terms in an expression that are
        //   not separated by any other operator.  Action is invoked between the
        //   actions for the two terms.
        {
            fixOpStack(RBBINode::precOpCat);
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *catNode     = pushNewNode(RBBINode::opCat);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            catNode->fLeftChild    = operandNode;
            operandNode->fParent   = catNode;
        }
        break;

    case doLParen:
        // Open Paren.
        //   The openParen node is a dummy operation type with a low precedence,
        //     which has the affect of ensuring that any real binary op that
        //     follows within the parens binds more tightly to the operands than
        //     stuff outside of the parens.
        pushNewNode(RBBINode::opLParen);
        break;

    case doExprRParen:
        fixOpStack(RBBINode::precLParen);
        break;

    case doNOP:
        break;

    case doStartAssign:
        // We've just scanned "$variable = "
        // The top of the node stack has the $variable ref node.

        // Save the start position of the RHS text in the StartExpression node
        //   that precedes the $variableReference node on the stack.
        //   This will eventually be used when saving the full $variable replacement
        //   text as a string.
        n = fNodeStack[fNodeStackPtr-1];
        n->fFirstPos = fNextIndex;              // move past the '='

        // Push a new start-of-expression node; needed to keep parse of the
        //   RHS expression happy.
        pushNewNode(RBBINode::opStart);
        break;




    case doEndAssign:
        {
            // We have reached the end of an assignement statement.
            //   Current scan char is the ';' that terminates the assignment.

            // Terminate expression, leaves expression parse tree rooted in TOS node.
            fixOpStack(RBBINode::precStart);

            RBBINode *startExprNode  = fNodeStack[fNodeStackPtr-2];
            RBBINode *varRefNode     = fNodeStack[fNodeStackPtr-1];
            RBBINode *RHSExprNode    = fNodeStack[fNodeStackPtr];

            // Save original text of right side of assignment, excluding the terminating ';'
            //  in the root of the node for the right-hand-side expression.
            RHSExprNode->fFirstPos = startExprNode->fFirstPos;
            RHSExprNode->fLastPos  = fScanIndex;
            fRB->fRules.extractBetween(RHSExprNode->fFirstPos, RHSExprNode->fLastPos, RHSExprNode->fText);

            // Expression parse tree becomes l. child of the $variable reference node.
            varRefNode->fLeftChild = RHSExprNode;
            RHSExprNode->fParent   = varRefNode;

            // Make a symbol table entry for the $variableRef node.
            fSymbolTable->addEntry(varRefNode->fText, varRefNode, *fRB->fStatus);
            if (U_FAILURE(*fRB->fStatus)) {
                // This is a round-about way to get the parse position set
                //  so that duplicate symbols error messages include a line number.
                UErrorCode t = *fRB->fStatus;
                *fRB->fStatus = U_ZERO_ERROR;
                error(t);
            }

            // Clean up the stack.
            delete startExprNode;
            fNodeStackPtr-=3;
            break;
        }

    case doEndOfRule:
        {
        fixOpStack(RBBINode::precStart);      // Terminate expression, leaves expression
        if (U_FAILURE(*fRB->fStatus)) {       //   parse tree rooted in TOS node.
            break;
        }
#ifdef RBBI_DEBUG
        if (fRB->fDebugEnv && uprv_strstr(fRB->fDebugEnv, "rtree")) {printNodeStack("end of rule");}
#endif
        U_ASSERT(fNodeStackPtr == 1);
        RBBINode *thisRule = fNodeStack[fNodeStackPtr];

        // If this rule includes a look-ahead '/', add a endMark node to the
        //   expression tree.
        if (fLookAheadRule) {
            RBBINode  *endNode        = pushNewNode(RBBINode::endMark);
            RBBINode  *catNode        = pushNewNode(RBBINode::opCat);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            fNodeStackPtr -= 2;
            catNode->fLeftChild       = thisRule;
            catNode->fRightChild      = endNode;
            fNodeStack[fNodeStackPtr] = catNode;
            endNode->fVal             = fRuleNum;
            endNode->fLookAheadEnd    = TRUE;
            thisRule                  = catNode;

            // TODO: Disable chaining out of look-ahead (hard break) rules.
            //   The break on rule match is forced, so there is no point in building up
            //   the state table to chain into another rule for a longer match.
        }

        // Mark this node as being the root of a rule.
        thisRule->fRuleRoot = TRUE;

        // Flag if chaining into this rule is wanted.
        //    
        if (fRB->fChainRules &&         // If rule chaining is enabled globally via !!chain
                !fNoChainInRule) {      //     and no '^' chain-in inhibit was on this rule
            thisRule->fChainIn = TRUE;
        }


        // All rule expressions are ORed together.
        // The ';' that terminates an expression really just functions as a '|' with
        //   a low operator prededence.
        //
        // Each of the four sets of rules are collected separately.
        //  (forward, reverse, safe_forward, safe_reverse)
        //  OR this rule into the appropriate group of them.
        //
        RBBINode **destRules = (fReverseRule? &fRB->fSafeRevTree : fRB->fDefaultTree);

        if (*destRules != NULL) {
            // This is not the first rule encounted.
            // OR previous stuff  (from *destRules)
            // with the current rule expression (on the Node Stack)
            //  with the resulting OR expression going to *destRules
            //
                       thisRule    = fNodeStack[fNodeStackPtr];
            RBBINode  *prevRules   = *destRules;
            RBBINode  *orNode      = pushNewNode(RBBINode::opOr);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            orNode->fLeftChild     = prevRules;
            prevRules->fParent     = orNode;
            orNode->fRightChild    = thisRule;
            thisRule->fParent      = orNode;
            *destRules             = orNode;
        }
        else
        {
            // This is the first rule encountered (for this direction).
            // Just move its parse tree from the stack to *destRules.
            *destRules = fNodeStack[fNodeStackPtr];
        }
        fReverseRule   = FALSE;   // in preparation for the next rule.
        fLookAheadRule = FALSE;
        fNoChainInRule = FALSE;
        fNodeStackPtr  = 0;
        }
        break;


    case doRuleError:
        error(U_BRK_RULE_SYNTAX);
        returnVal = FALSE;
        break;


    case doVariableNameExpectedErr:
        error(U_BRK_RULE_SYNTAX);
        break;


    //
    //  Unary operands  + ? *
    //    These all appear after the operand to which they apply.
    //    When we hit one, the operand (may be a whole sub expression)
    //    will be on the top of the stack.
    //    Unary Operator becomes TOS, with the old TOS as its one child.
    case doUnaryOpPlus:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *plusNode    = pushNewNode(RBBINode::opPlus);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            plusNode->fLeftChild   = operandNode;
            operandNode->fParent   = plusNode;
        }
        break;

    case doUnaryOpQuestion:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *qNode       = pushNewNode(RBBINode::opQuestion);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            qNode->fLeftChild      = operandNode;
            operandNode->fParent   = qNode;
        }
        break;

    case doUnaryOpStar:
        {
            RBBINode  *operandNode = fNodeStack[fNodeStackPtr--];
            RBBINode  *starNode    = pushNewNode(RBBINode::opStar);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            starNode->fLeftChild   = operandNode;
            operandNode->fParent   = starNode;
        }
        break;

    case doRuleChar:
        // A "Rule Character" is any single character that is a literal part
        // of the regular expression.  Like a, b and c in the expression "(abc*) | [:L:]"
        // These are pretty uncommon in break rules; the terms are more commonly
        //  sets.  To keep things uniform, treat these characters like as
        // sets that just happen to contain only one character.
        {
            n = pushNewNode(RBBINode::setRef);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            findSetFor(UnicodeString(fC.fChar), n);
            n->fFirstPos = fScanIndex;
            n->fLastPos  = fNextIndex;
            fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
            break;
        }

    case doDotAny:
        // scanned a ".", meaning match any single character.
        {
            n = pushNewNode(RBBINode::setRef);
            if (U_FAILURE(*fRB->fStatus)) {
                break;
            }
            findSetFor(UnicodeString(TRUE, kAny, 3), n);
            n->fFirstPos = fScanIndex;
            n->fLastPos  = fNextIndex;
            fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
            break;
        }

    case doSlash:
        // Scanned a '/', which identifies a look-ahead break position in a rule.
        n = pushNewNode(RBBINode::lookAhead);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fVal      = fRuleNum;
        n->fFirstPos = fScanIndex;
        n->fLastPos  = fNextIndex;
        fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
        fLookAheadRule = TRUE;
        break;


    case doStartTagValue:
        // Scanned a '{', the opening delimiter for a tag value within a rule.
        n = pushNewNode(RBBINode::tag);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fVal      = 0;
        n->fFirstPos = fScanIndex;
        n->fLastPos  = fNextIndex;
        break;

    case doTagDigit:
        // Just scanned a decimal digit that's part of a tag value
        {
            n = fNodeStack[fNodeStackPtr];
            uint32_t v = u_charDigitValue(fC.fChar);
            U_ASSERT(v < 10);
            n->fVal = n->fVal*10 + v;
            break;
        }

    case doTagValue:
        n = fNodeStack[fNodeStackPtr];
        n->fLastPos = fNextIndex;
        fRB->fRules.extractBetween(n->fFirstPos, n->fLastPos, n->fText);
        break;

    case doTagExpectedError:
        error(U_BRK_MALFORMED_RULE_TAG);
        returnVal = FALSE;
        break;

    case doOptionStart:
        // Scanning a !!option.   At the start of string.
        fOptionStart = fScanIndex;
        break;

    case doOptionEnd:
        {
            UnicodeString opt(fRB->fRules, fOptionStart, fScanIndex-fOptionStart);
            if (opt == UNICODE_STRING("chain", 5)) {
                fRB->fChainRules = TRUE;
            } else if (opt == UNICODE_STRING("LBCMNoChain", 11)) {
                fRB->fLBCMNoChain = TRUE;
            } else if (opt == UNICODE_STRING("forward", 7)) {
                fRB->fDefaultTree   = &fRB->fForwardTree;
            } else if (opt == UNICODE_STRING("reverse", 7)) {
                fRB->fDefaultTree   = &fRB->fReverseTree;
            } else if (opt == UNICODE_STRING("safe_forward", 12)) {
                fRB->fDefaultTree   = &fRB->fSafeFwdTree;
            } else if (opt == UNICODE_STRING("safe_reverse", 12)) {
                fRB->fDefaultTree   = &fRB->fSafeRevTree;
            } else if (opt == UNICODE_STRING("lookAheadHardBreak", 18)) {
                fRB->fLookAheadHardBreak = TRUE;
            } else if (opt == UNICODE_STRING("quoted_literals_only", 20)) {
                fRuleSets[kRuleSet_rule_char-128].clear();
            } else if (opt == UNICODE_STRING("unquoted_literals",  17)) {
                fRuleSets[kRuleSet_rule_char-128].applyPattern(UnicodeString(gRuleSet_rule_char_pattern), *fRB->fStatus);
            } else {
                error(U_BRK_UNRECOGNIZED_OPTION);
            }
        }
        break;

    case doReverseDir:
        fReverseRule = TRUE;
        break;

    case doStartVariableName:
        n = pushNewNode(RBBINode::varRef);
        if (U_FAILURE(*fRB->fStatus)) {
            break;
        }
        n->fFirstPos = fScanIndex;
        break;

    case doEndVariableName:
        n = fNodeStack[fNodeStackPtr];
        if (n==NULL || n->fType != RBBINode::varRef) {
            error(U_BRK_INTERNAL_ERROR);
            break;
        }
        n->fLastPos = fScanIndex;
        fRB->fRules.extractBetween(n->fFirstPos+1, n->fLastPos, n->fText);
        // Look the newly scanned name up in the symbol table
        //   If there's an entry, set the l. child of the var ref to the replacement expression.
        //   (We also pass through here when scanning assignments, but no harm is done, other
        //    than a slight wasted effort that seems hard to avoid.  Lookup will be null)
        n->fLeftChild = fSymbolTable->lookupNode(n->fText);
        break;

    case doCheckVarDef:
        n = fNodeStack[fNodeStackPtr];
        if (n->fLeftChild == NULL) {
            error(U_BRK_UNDEFINED_VARIABLE);
            returnVal = FALSE;
        }
        break;

    case doExprFinished:
        break;

    case doRuleErrorAssignExpr:
        error(U_BRK_ASSIGN_ERROR);
        returnVal = FALSE;
        break;

    case doExit:
        returnVal = FALSE;
        break;

    case doScanUnicodeSet:
        scanSet();
        break;

    default:
        error(U_BRK_INTERNAL_ERROR);
        returnVal = FALSE;
        break;
    }
    return returnVal && U_SUCCESS(*fRB->fStatus);
}